

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar13;
  ulong uVar14;
  uint16_t uVar15;
  byte *pbVar16;
  byte *pbVar17;
  ushort uVar18;
  int iVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  Number NVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pbVar3 = (byte *)is->src_;
  pCVar4 = is->head_;
  bVar2 = *pbVar3;
  pbVar16 = pbVar3;
  bVar20 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar16 = pbVar3 + 1;
    bVar20 = pbVar3[1];
  }
  pCVar5 = is->dst_;
  if (bVar20 == 0x30) {
    uVar21 = (uint)pbVar16[1];
    pbVar16 = pbVar16 + 1;
    dVar24 = 0.0;
    bVar8 = false;
    bVar7 = false;
    iVar9 = 0;
    uVar23 = 0;
    bVar6 = false;
    uVar22 = 0;
    goto LAB_002a9ca2;
  }
  if ((byte)(bVar20 - 0x31) < 9) {
    uVar22 = bVar20 - 0x30;
    bVar20 = pbVar16[1];
    uVar14 = (ulong)bVar20;
    pbVar16 = pbVar16 + 1;
    dVar24 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar20 - 0x30) < 10) {
        iVar9 = 0;
LAB_002a9aff:
        if (uVar22 < 0xccccccc) {
LAB_002a9b08:
          uVar22 = (uVar22 * 10 + (int)uVar14) - 0x30;
          iVar9 = iVar9 + 1;
          bVar20 = pbVar16[1];
          uVar14 = (ulong)bVar20;
          pbVar16 = pbVar16 + 1;
          if (9 < (byte)(bVar20 - 0x30)) goto LAB_002a9bdc;
          goto LAB_002a9aff;
        }
        if (uVar22 != 0xccccccc) goto LAB_002a9b80;
        if ((byte)uVar14 < 0x39) goto LAB_002a9b08;
        uVar22 = 0xccccccc;
        uVar14 = 0x39;
LAB_002a9b80:
        uVar23 = (ulong)uVar22;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar23) && (0x38 < (byte)uVar14 || uVar23 != 0xccccccccccccccc)
               ) goto LAB_002a9c2e;
            uVar23 = (uVar14 & 0xf) + uVar23 * 10;
            iVar9 = iVar9 + 1;
            bVar20 = pbVar16[1];
            uVar14 = (ulong)bVar20;
            pbVar16 = pbVar16 + 1;
          } while ((byte)(bVar20 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar23) &&
               (0x35 < (byte)uVar14 || uVar23 != 0x1999999999999999)) goto LAB_002a9c2e;
            uVar23 = (uVar14 & 0xf) + uVar23 * 10;
            iVar9 = iVar9 + 1;
            bVar20 = pbVar16[1];
            uVar14 = (ulong)bVar20;
            pbVar16 = pbVar16 + 1;
          } while ((byte)(bVar20 - 0x30) < 10);
        }
        uVar21 = (uint)bVar20;
        dVar24 = 0.0;
        bVar6 = true;
        bVar8 = false;
        bVar7 = false;
        goto LAB_002a9ca2;
      }
LAB_002a9f1b:
      iVar9 = 0;
    }
    else {
      if (9 < (byte)(bVar20 - 0x30)) goto LAB_002a9f1b;
      iVar9 = 0;
      do {
        if (0x19999998 < uVar22) {
          if (uVar22 != 0x19999999) goto LAB_002a9b80;
          if (0x35 < (byte)uVar14) {
            uVar22 = 0x19999999;
            goto LAB_002a9b80;
          }
        }
        uVar22 = (uVar22 * 10 + (int)uVar14) - 0x30;
        iVar9 = iVar9 + 1;
        bVar20 = pbVar16[1];
        uVar14 = (ulong)bVar20;
        pbVar16 = pbVar16 + 1;
      } while ((byte)(bVar20 - 0x30) < 10);
    }
LAB_002a9bdc:
    uVar21 = (uint)bVar20;
    bVar8 = false;
    bVar7 = false;
    uVar23 = 0;
    bVar6 = false;
    goto LAB_002a9ca2;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x5fd,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar12 = (long)pbVar16 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
LAB_002a9f12:
  *(long *)(this + 0x38) = lVar12;
  goto LAB_002aa16b;
LAB_002a9ed7:
  do {
    pbVar17 = pbVar16 + 1;
    pbVar16 = pbVar16 + 1;
  } while ((byte)(*pbVar17 - 0x30) < 10);
LAB_002a9f8c:
  iVar9 = -iVar10;
  if (!bVar8) {
    iVar9 = iVar10;
  }
LAB_002a9f98:
  if (!bVar7) {
    if (bVar6) {
      if (bVar2 == 0x2d) {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar23);
        if (!bVar8) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x6b6,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          *(undefined4 *)(this + 0x30) = 0x10;
          *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
        }
      }
      else {
        pGVar13 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar13->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar13->data_ = uVar23;
        uVar18 = (ushort)((uVar23 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
        if (uVar23 >> 0x20 != 0) {
          uVar18 = (ushort)(-1 < (long)uVar23) << 7 | 0x116;
        }
        (pGVar13->data_).f.flags = uVar18;
      }
    }
    else if (bVar2 == 0x2d) {
      pGVar13 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar13->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar13->data_ = (long)(int)-uVar22;
      uVar15 = 0xb6;
      if ((int)uVar22 < 1) {
        uVar15 = 0x1f6;
      }
      (pGVar13->data_).f.flags = uVar15;
    }
    else {
      pGVar13 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar13->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar13->data_ = uVar14;
      (pGVar13->data_).f.flags = (ushort)(-1 < (int)uVar22) << 5 | 0x1d6;
    }
    goto LAB_002aa16b;
  }
  goto LAB_002a9f9d;
LAB_002a9c2e:
  auVar26._8_4_ = (int)(uVar23 >> 0x20);
  auVar26._0_8_ = uVar23;
  auVar26._12_4_ = 0x45300000;
  dVar24 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
  do {
    if (1.7976931348623158e+307 <= dVar24) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x61e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_002a9f7a;
    }
    dVar24 = dVar24 * 10.0 + (double)((int)uVar14 + -0x30);
    bVar20 = pbVar16[1];
    uVar14 = (ulong)bVar20;
    uVar21 = (uint)bVar20;
    pbVar16 = pbVar16 + 1;
  } while ((byte)(bVar20 - 0x30) < 10);
  bVar8 = true;
  bVar7 = true;
  bVar6 = true;
LAB_002a9ca2:
  uVar14 = (ulong)uVar22;
  if ((char)uVar21 != '.') {
    iVar19 = 0;
LAB_002a9e1e:
    iVar9 = 0;
    if ((uVar21 | 0x20) == 0x65) {
      uVar11 = uVar14;
      if (bVar6) {
        uVar11 = uVar23;
      }
      if (!bVar7) {
        auVar28._8_4_ = (int)(uVar11 >> 0x20);
        auVar28._0_8_ = uVar11;
        auVar28._12_4_ = 0x45300000;
        dVar24 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        bVar7 = true;
      }
      bVar20 = pbVar16[1];
      bVar8 = bVar20 != 0x2b;
      if ((bVar8) && (bVar20 != 0x2d)) {
        if (9 < (byte)(bVar20 - 0x30)) {
          pbVar16 = pbVar16 + 1;
LAB_002a9ef2:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x676,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar12 = (long)pbVar16 - (long)pCVar4;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_002a9f12;
        }
        pbVar16 = pbVar16 + 2;
        iVar10 = bVar20 - 0x30;
      }
      else {
        pbVar17 = pbVar16 + 2;
        if (9 < (byte)(*pbVar17 - 0x30)) {
          pbVar16 = pbVar16 + 2;
          goto LAB_002a9ef2;
        }
        pbVar16 = pbVar16 + 3;
        iVar10 = *pbVar17 - 0x30;
        if (bVar20 != 0x2b) {
          bVar20 = *pbVar16;
          if ((byte)(bVar20 - 0x30) < 10) {
            do {
              iVar10 = iVar10 * 10 + (uint)bVar20 + -0x30;
              if (0xccccccb < iVar10) goto LAB_002a9ed7;
              pbVar16 = pbVar16 + 1;
              bVar20 = *pbVar16;
            } while ((byte)(bVar20 - 0x30) < 10);
          }
          else {
            bVar8 = true;
          }
          goto LAB_002a9f8c;
        }
      }
      do {
        bVar20 = *pbVar16;
        if (9 < (byte)(bVar20 - 0x30)) {
          bVar8 = false;
          goto LAB_002a9f8c;
        }
        pbVar16 = pbVar16 + 1;
        iVar10 = iVar10 * 10 + (uint)bVar20 + -0x30;
      } while (iVar10 <= 0x134 - iVar19);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x671,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_002a9f7a:
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
      goto LAB_002aa16b;
    }
    goto LAB_002a9f98;
  }
  uVar21 = (uint)pbVar16[1];
  pbVar17 = pbVar16 + 1;
  if ((byte)(pbVar16[1] - 0x3a) < 0xf6) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x62a,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xe;
    *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
    pbVar16 = pbVar17;
    goto LAB_002aa16b;
  }
  iVar19 = 0;
  if (bVar8) {
LAB_002a9d54:
    do {
      pbVar16 = pbVar17;
      if (0x39 < (byte)uVar21) goto LAB_002a9e1e;
      if (iVar9 < 0x11) {
        dVar24 = dVar24 * 10.0 + (double)(int)(uVar21 - 0x30);
        iVar19 = iVar19 + -1;
        if (0.0 < dVar24) {
          iVar9 = iVar9 + 1;
        }
      }
      pbVar1 = pbVar17 + 1;
      uVar21 = (uint)*pbVar1;
      pbVar16 = pbVar17 + 1;
      pbVar17 = pbVar16;
    } while ('/' < (char)*pbVar1);
    iVar9 = 0;
    goto LAB_002a9f98;
  }
  if (!bVar6) {
    uVar23 = uVar14;
  }
  iVar19 = 0;
  do {
    if ((0x39 < (byte)uVar21) || (uVar23 >> 0x35 != 0)) {
      auVar27._8_4_ = (int)(uVar23 >> 0x20);
      auVar27._0_8_ = uVar23;
      auVar27._12_4_ = 0x45300000;
      dVar24 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
      bVar7 = true;
      goto LAB_002a9d54;
    }
    pbVar16 = pbVar17 + 1;
    iVar19 = iVar19 + -1;
    uVar23 = (ulong)(uVar21 - 0x30) + uVar23 * 10;
    iVar9 = iVar9 + (uint)(uVar23 != 0);
    pbVar1 = pbVar17 + 1;
    uVar21 = (uint)*pbVar1;
    pbVar17 = pbVar16;
  } while ('/' < (char)*pbVar1);
  dVar24 = (double)(long)uVar23;
  iVar9 = 0;
LAB_002a9f9d:
  uVar21 = iVar9 + iVar19;
  if ((int)uVar21 < -0x134) {
    NVar25.i64 = 0;
    if (0xfffffd97 < uVar21) {
      NVar25.d = (dVar24 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar21 - 0x134) * 8);
    }
  }
  else if ((int)uVar21 < 0) {
    NVar25.d = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar21 * 8);
  }
  else {
    if (0x134 < uVar21) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    NVar25.d = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar21 * 8);
  }
  pGVar13 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  if (bVar2 == 0x2d) {
    NVar25.u64 = NVar25.u64 ^ 0x8000000000000000;
  }
  (pGVar13->data_).s.str = (Ch *)0x216000000000000;
  (pGVar13->data_).n = NVar25;
LAB_002aa16b:
  is->src_ = (Ch *)pbVar16;
  is->dst_ = pCVar5;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }